

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int buffer_append(Buffer *buffer,void *_data,size_t len)

{
  uint8 *puVar1;
  BufferBlock *pBVar2;
  uint8 *local_80;
  size_t local_78;
  ulong local_70;
  BufferBlock *item;
  size_t malloc_len;
  size_t bytecount;
  size_t cpy;
  size_t avail;
  size_t tailbytes;
  size_t blocksize;
  uint8 *data;
  size_t len_local;
  void *_data_local;
  Buffer *buffer_local;
  
  local_80 = (uint8 *)buffer->block_size;
  if (len != 0) {
    blocksize = (size_t)_data;
    data = (uint8 *)len;
    if (buffer->tail != (BufferBlock *)0x0) {
      puVar1 = (uint8 *)buffer->tail->bytes;
      if (puVar1 < local_80) {
        local_70 = (long)local_80 - (long)puVar1;
      }
      else {
        local_70 = 0;
      }
      local_78 = len;
      if (local_70 <= len) {
        local_78 = local_70;
      }
      if (local_78 != 0) {
        memcpy(puVar1 + (long)buffer->tail->data,_data,local_78);
        data = (uint8 *)(len - local_78);
        blocksize = local_78 + (long)_data;
        buffer->tail->bytes = local_78 + buffer->tail->bytes;
        buffer->total_bytes = local_78 + buffer->total_bytes;
        if (local_80 < (uint8 *)buffer->tail->bytes) {
          __assert_fail("buffer->tail->bytes <= blocksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x301,"int buffer_append(Buffer *, const void *, size_t)");
        }
      }
    }
    if (data != (uint8 *)0x0) {
      if ((buffer->tail != (BufferBlock *)0x0) && ((uint8 *)buffer->tail->bytes < local_80)) {
        __assert_fail("(!buffer->tail) || (buffer->tail->bytes >= blocksize)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x307,"int buffer_append(Buffer *, const void *, size_t)");
      }
      if (local_80 < data) {
        local_80 = data;
      }
      pBVar2 = (BufferBlock *)(*buffer->m)((int)local_80 + 0x18,buffer->d);
      if (pBVar2 == (BufferBlock *)0x0) {
        return 0;
      }
      pBVar2->data = (uint8 *)(pBVar2 + 1);
      pBVar2->bytes = (size_t)data;
      pBVar2->next = (BufferBlock *)0x0;
      if (buffer->tail == (BufferBlock *)0x0) {
        buffer->head = pBVar2;
      }
      else {
        buffer->tail->next = pBVar2;
      }
      buffer->tail = pBVar2;
      memcpy(pBVar2->data,(void *)blocksize,(size_t)data);
      buffer->total_bytes = (size_t)(data + buffer->total_bytes);
    }
  }
  return 1;
}

Assistant:

int buffer_append(Buffer *buffer, const void *_data, size_t len)
{
    const uint8 *data = (const uint8 *) _data;

    // note that we make the blocks bigger than blocksize when we have enough
    //  data to overfill a fresh block, to reduce allocations.
    const size_t blocksize = buffer->block_size;

    if (len == 0)
        return 1;

    if (buffer->tail != NULL)
    {
        const size_t tailbytes = buffer->tail->bytes;
        const size_t avail = (tailbytes >= blocksize) ? 0 : blocksize - tailbytes;
        const size_t cpy = (avail > len) ? len : avail;
        if (cpy > 0)
        {
            memcpy(buffer->tail->data + tailbytes, data, cpy);
            len -= cpy;
            data += cpy;
            buffer->tail->bytes += cpy;
            buffer->total_bytes += cpy;
            assert(buffer->tail->bytes <= blocksize);
        } // if
    } // if

    if (len > 0)
    {
        assert((!buffer->tail) || (buffer->tail->bytes >= blocksize));
        const size_t bytecount = len > blocksize ? len : blocksize;
        const size_t malloc_len = sizeof (BufferBlock) + bytecount;
        BufferBlock *item = (BufferBlock *) buffer->m(malloc_len, buffer->d);
        if (item == NULL)
            return 0;

        item->data = ((uint8 *) item) + sizeof (BufferBlock);
        item->bytes = len;
        item->next = NULL;
        if (buffer->tail != NULL)
            buffer->tail->next = item;
        else
            buffer->head = item;
        buffer->tail = item;

        memcpy(item->data, data, len);
        buffer->total_bytes += len;
    } // if

    return 1;
}